

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# question_8.cpp
# Opt level: O0

bool judge(int x)

{
  code *pcVar1;
  int local_14;
  int i;
  int m;
  int x_local;
  
  local_14 = 0;
  for (i = x; i != 0; i = i / 10) {
    digital[local_14] = i % 10;
    local_14 = local_14 + 1;
  }
  if (0 < local_14 / 2) {
    return digital[0] == digital[local_14 + -1];
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

bool judge(int x)
{

    int m=0;
    while(x)   //把x一位一位的向digital数组中存
    {
        digital[m++] = x % 10;
        x /= 10;
    }                                               //比较前半边与后半边的数是否相等，不论x是偶数还是奇数，
    for (int i = 0; i < m / 2; ++i) {               //都除以二(m是int类型，除二取小数点前整数。为基数时如12321，就只用比较前两位和后两位； 为偶数时如123321，就比较前三位和后三位)
        if(digital[i] != digital[m - 1 - i])        //为什么是 m-1-i？ --->  是因为下标i的取值范围是0到m-1， 第i个对应末尾就是 （m-1）-i 的个
            return false;
        else
            return true;
    }
}